

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::SmallInteger::stQuotient(InterpreterProxy *interpreter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar3) != 1) {
    iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar3;
  }
  uVar4 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  uVar5 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  if ((((uVar4 & 1) != 0) && ((uVar5 & 1) != 0)) && (1 < CONCAT44(extraout_var_01,uVar5))) {
    auVar1 = SEXT816((long)CONCAT44(extraout_var_01,uVar5) >> 1);
    auVar2._8_8_ = (long)extraout_var_00 >> 0x1f;
    auVar2._0_8_ = CONCAT44(extraout_var_00,uVar4) >> 1;
    iVar3 = (*interpreter->_vptr_InterpreterProxy[0x16])
                      (interpreter,SUB168(auVar2 / auVar1,0),SUB168(auVar2 % auVar1,0),
                       interpreter->_vptr_InterpreterProxy[0x16]);
    return iVar3;
  }
  iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar3;
}

Assistant:

int SmallInteger::stQuotient(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isSmallInteger() || !b.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = a.decodeSmallInteger();
    auto ib = b.decodeSmallInteger();
    if(ib == 0)
        return interpreter->primitiveFailed();
    return interpreter->returnInteger(ia / ib);
}